

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  bool bVar1;
  Json *pJVar2;
  Value *root;
  uint length;
  bool value_00;
  LargestUInt value_01;
  char *value_02;
  LargestInt value_03;
  string *key;
  double value_04;
  string sStack_78;
  allocator local_51;
  char *end;
  char *str;
  string *local_40;
  
  length = 0x145704;
  switch(value->field_0x8) {
  case 0:
    std::__cxx11::string::string((string *)&sStack_78,"null",(allocator *)&str);
    pushValue(this,&sStack_78);
    break;
  case 1:
    pJVar2 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&sStack_78,pJVar2,value_03);
    pushValue(this,&sStack_78);
    break;
  case 2:
    pJVar2 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&sStack_78,pJVar2,value_01);
    pushValue(this,&sStack_78);
    break;
  case 3:
    value_04 = Value::asDouble(value);
    valueToString_abi_cxx11_(&sStack_78,(Json *)value,value_04);
    pushValue(this,&sStack_78);
    break;
  case 4:
    bVar1 = Value::getString(value,&str,&end);
    if (bVar1) {
      valueToQuotedStringN_abi_cxx11_
                (&sStack_78,(Json *)str,(char *)(ulong)(uint)((int)end - (int)str),length);
      pushValue(this,&sStack_78);
    }
    else {
      std::__cxx11::string::string((string *)&sStack_78,"",&local_51);
      pushValue(this,&sStack_78);
    }
    break;
  case 5:
    bVar1 = Value::asBool(value);
    valueToString_abi_cxx11_(&sStack_78,(Json *)(ulong)bVar1,value_00);
    pushValue(this,&sStack_78);
    break;
  case 6:
    writeArrayValue(this,value);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_((Members *)&str,value);
    if ((string *)str == local_40) {
      std::__cxx11::string::string((string *)&sStack_78,"{}",(allocator *)&end);
      pushValue(this,&sStack_78);
    }
    else {
      std::__cxx11::string::string((string *)&sStack_78,"{",(allocator *)&end);
      writeWithIndent(this,&sStack_78);
      std::__cxx11::string::~string((string *)&sStack_78);
      indent(this);
      key = (string *)str;
      while( true ) {
        root = Value::operator[](value,key);
        writeCommentBeforeValue(this,root);
        valueToQuotedString_abi_cxx11_(&sStack_78,(Json *)(key->_M_dataplus)._M_p,value_02);
        writeWithIndent(this,&sStack_78);
        std::__cxx11::string::~string((string *)&sStack_78);
        std::__cxx11::string::append((char *)&this->document_);
        writeValue(this,root);
        key = key + 1;
        if (key == local_40) break;
        std::__cxx11::string::push_back((char)&this->document_);
        writeCommentAfterValueOnSameLine(this,root);
      }
      writeCommentAfterValueOnSameLine(this,root);
      unindent(this);
      std::__cxx11::string::string((string *)&sStack_78,"}",(allocator *)&end);
      writeWithIndent(this,&sStack_78);
    }
    std::__cxx11::string::~string((string *)&sStack_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&str);
  default:
    goto switchD_0012c328_default;
  }
  std::__cxx11::string::~string((string *)&sStack_78);
switchD_0012c328_default:
  return;
}

Assistant:

ValueType Value::type() const { return type_; }